

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalValenceEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  int iVar1;
  iterator __position;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer pIVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  iterator __position_00;
  uint local_38;
  int local_34;
  
  this->num_symbols_ = this->num_symbols_ + 1;
  uVar6 = (this->last_corner_).value_;
  uVar7 = (ulong)uVar6;
  if (uVar7 == 0xffffffff) {
    uVar2 = 0xffffffff;
    uVar6 = 0xffffffff;
  }
  else {
    uVar2 = uVar6 - 2;
    if (0x55555555 < (uVar6 + 1) * -0x55555555) {
      uVar2 = uVar6 + 1;
    }
    if (uVar6 * -0x55555555 < 0x55555556) {
      uVar6 = uVar6 + 2;
    }
    else {
      uVar6 = uVar6 - 1;
    }
  }
  pIVar5 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar4[pIVar5[uVar2].value_];
  switch(symbol) {
  case TOPOLOGY_C:
  case TOPOLOGY_S:
    piVar4[pIVar5[uVar2].value_] = iVar1 + -1;
    piVar4[pIVar5[uVar6].value_] = piVar4[pIVar5[uVar6].value_] + -1;
    if (symbol == TOPOLOGY_S) {
      iVar9 = 1;
      if (uVar6 == 0xffffffff) {
        iVar10 = 1;
      }
      else {
        uVar6 = (this->corner_table_->opposite_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
        iVar10 = 1;
        if (uVar6 != 0xffffffff) {
          iVar3 = 0;
          do {
            iVar10 = iVar3;
            iVar3 = (*((this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_)->
                      _vptr_MeshEdgebreakerEncoderImplInterface[9])();
            if ((char)iVar3 != '\0') goto LAB_00140526;
            uVar8 = uVar6 - 2;
            if (0x55555555 < (uVar6 + 1) * -0x55555555) {
              uVar8 = uVar6 + 1;
            }
            if (uVar8 == 0xffffffff) break;
            uVar6 = (this->corner_table_->opposite_corners_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
            iVar3 = iVar10 + 1;
          } while (uVar6 != 0xffffffff);
          iVar10 = iVar10 + 1;
LAB_00140526:
          pIVar5 = (this->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar10 = iVar10 + 1;
        }
      }
      piVar4[pIVar5[(this->last_corner_).value_].value_] = iVar10;
      __position_00._M_current =
           (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((uVar2 != 0xffffffff) &&
         (uVar6 = (this->corner_table_->opposite_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2].value_, uVar6 != 0xffffffff)) {
        iVar10 = 0;
        do {
          iVar9 = iVar10;
          iVar10 = (*((this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_)->
                     _vptr_MeshEdgebreakerEncoderImplInterface[9])();
          if ((char)iVar10 != '\0') goto LAB_00140649;
          uVar2 = uVar6 - 2;
          if (0x55555555 < (uVar6 + 1) * -0x55555555) {
            uVar2 = uVar6 + 1;
          }
          (this->corner_to_vertex_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar2].value_ =
               (uint)((ulong)((long)__position_00._M_current - (long)piVar4) >> 2);
          if (uVar6 % 3 == 0) {
            uVar6 = uVar6 + 2;
            if (uVar6 == 0xffffffff) break;
          }
          else {
            uVar6 = uVar6 - 1;
          }
          uVar6 = (this->corner_table_->opposite_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
          iVar10 = iVar9 + 1;
        } while (uVar6 != 0xffffffff);
        iVar9 = iVar9 + 1;
LAB_00140649:
        __position_00._M_current =
             (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        iVar9 = iVar9 + 1;
      }
      local_34 = iVar9;
      if (__position_00._M_current ==
          (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->vertex_valences_).vector_,__position_00,&local_34);
      }
      else {
        *__position_00._M_current = iVar9;
        (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    break;
  case TOPOLOGY_L:
    piVar4[pIVar5[uVar7].value_] = piVar4[pIVar5[uVar7].value_] + -1;
    piVar4[pIVar5[uVar2].value_] = piVar4[pIVar5[uVar2].value_] + -2;
    piVar4[pIVar5[uVar6].value_] = piVar4[pIVar5[uVar6].value_] + -1;
    break;
  case TOPOLOGY_R:
    piVar4[pIVar5[uVar7].value_] = piVar4[pIVar5[uVar7].value_] + -1;
    piVar4[pIVar5[uVar2].value_] = piVar4[pIVar5[uVar2].value_] + -1;
    goto LAB_00140572;
  case TOPOLOGY_E:
    piVar4[pIVar5[uVar7].value_] = piVar4[pIVar5[uVar7].value_] + -2;
    piVar4[pIVar5[uVar2].value_] = piVar4[pIVar5[uVar2].value_] + -2;
LAB_00140572:
    piVar4[pIVar5[uVar6].value_] = piVar4[pIVar5[uVar6].value_] + -2;
  }
  if ((long)this->prev_symbol_ != -1) {
    iVar9 = this->max_valence_;
    if (iVar1 < this->max_valence_) {
      iVar9 = iVar1;
    }
    iVar10 = 0;
    if (this->min_valence_ <= iVar1) {
      iVar10 = iVar9 - this->min_valence_;
    }
    this_00 = (this->context_symbols_).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar10;
    local_38 = *(uint *)(edge_breaker_topology_to_symbol_id + (long)this->prev_symbol_ * 4);
    __position._M_current =
         (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  this->prev_symbol_ = symbol;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh and compute the context that is going to be
    // used to encode the processed symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh (i.e. the decoding is reverse). Adding a new symbol either reduces
    // valences on the vertices or leaves the valence unchanged.

    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);

    // Get valence on the tip corner of the active edge (outgoing edge that is
    // going to be used in reverse decoding of the connectivity to predict the
    // next symbol).
    const int active_valence = vertex_valences_[corner_to_vertex_map_[next]];
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, we need to split the vertex into
          // two and attach all corners on the left and right sides of the split
          // vertex to the respective vertices (see image below). This is
          // necessary since the decoder works in the reverse order and it
          // merges the two vertices only after the split symbol is processed.
          //
          //     * -----
          //    / \--------
          //   /   \--------
          //  /     \-------
          // *-------v-------*
          //  \     /c\     /
          //   \   /   \   /
          //    \ /n S p\ /
          //     *.......*
          //

          // Count the number of faces on the left side of the split vertex and
          // update the valence on the "left vertex".
          int num_left_faces = 0;
          CornerIndex act_c = corner_table_->Opposite(prev);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_left_faces;
            act_c = corner_table_->Opposite(corner_table_->Next(act_c));
          }
          vertex_valences_[corner_to_vertex_map_[last_corner_]] =
              num_left_faces + 1;

          // Create a new vertex for the right side and count the number of
          // faces that should be attached to this vertex.
          const int new_vert_id = static_cast<int>(vertex_valences_.size());
          int num_right_faces = 0;

          act_c = corner_table_->Opposite(next);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_right_faces;
            // Map corners on the right side to the newly created vertex.
            corner_to_vertex_map_[corner_table_->Next(act_c)] = new_vert_id;
            act_c = corner_table_->Opposite(corner_table_->Previous(act_c));
          }
          vertex_valences_.push_back(num_right_faces + 1);
        }
        break;
      case TOPOLOGY_R:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      case TOPOLOGY_L:

        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 2;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      default:
        break;
    }

    if (prev_symbol_ != -1) {
      int clamped_valence;
      if (active_valence < min_valence_) {
        clamped_valence = min_valence_;
      } else if (active_valence > max_valence_) {
        clamped_valence = max_valence_;
      } else {
        clamped_valence = active_valence;
      }

      const int context = clamped_valence - min_valence_;
      context_symbols_[context].push_back(
          edge_breaker_topology_to_symbol_id[prev_symbol_]);
    }

    prev_symbol_ = symbol;
  }